

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRP.cpp
# Opt level: O2

void __thiscall GLRP::loadParser(GLRP *this)

{
  ostream *poVar1;
  CFG *this_00;
  GLRParser *this_01;
  allocator<char> local_b9;
  vector<Production_*,_std::allocator<Production_*>_> productionsP;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  terminalsT;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nonTerminalsV;
  string startS;
  string local_38;
  
  if (this->loaded == false) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Creating CFG...");
    std::endl<char,std::char_traits<char>>(poVar1);
    nonTerminalsV.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    terminalsT.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    nonTerminalsV.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    nonTerminalsV.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    productionsP.super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    terminalsT.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    terminalsT.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    productionsP.super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    productionsP.super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    startS._M_dataplus._M_p = (pointer)&startS.field_2;
    startS._M_string_length = 0;
    startS.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"grammar/Simple Grammar/cpp.json",&local_b9);
    readJson(&local_38,&nonTerminalsV,&terminalsT,&productionsP,&startS);
    std::__cxx11::string::~string((string *)&local_38);
    this_00 = (CFG *)operator_new(0x68);
    CFG::CFG(this_00,&nonTerminalsV,&terminalsT,&productionsP,&startS);
    poVar1 = std::operator<<((ostream *)&std::cout,"Creating GLRParser...");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"This might take a while...");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "Hint: The parser has to be created only once per runtime. Once generated, all feautures will work a lot faster."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    this_01 = (GLRParser *)operator_new(0xa8);
    GLRParser::GLRParser(this_01,this_00,false);
    this->glrParser = this_01;
    poVar1 = std::operator<<((ostream *)&std::cout,"Done");
    std::endl<char,std::char_traits<char>>(poVar1);
    this->loaded = true;
    std::__cxx11::string::~string((string *)&startS);
    std::_Vector_base<Production_*,_std::allocator<Production_*>_>::~_Vector_base
              (&productionsP.super__Vector_base<Production_*,_std::allocator<Production_*>_>);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&terminalsT);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&nonTerminalsV);
  }
  return;
}

Assistant:

void GLRP::loadParser() {
    if (isLoaded())
        return;

    std::cout << "Creating CFG..." << std::endl;

    // Generate a CFG for the c++ language
    std::vector<std::string> nonTerminalsV;
    std::vector<std::string> terminalsT;
    std::vector<Production *> productionsP;
    std::string startS;

    readJson("grammar/Simple Grammar/cpp.json", nonTerminalsV, terminalsT, productionsP, startS);

    CFG *cfg = new CFG(nonTerminalsV, terminalsT, productionsP, startS);

    std::cout << "Creating GLRParser..." << std::endl;
    std::cout << "This might take a while..." << std::endl;
    std::cout << "Hint: The parser has to be created only once per runtime. Once generated, all feautures will work a lot faster." << std::endl;
    // Generate a GLRParser
    setGlrParser(new GLRParser(cfg, VERBOSE));

//    glrParser->toDot("output/GLRParser202500126.dot");

    std::cout << "Done" << std::endl;

    setLoaded(true);

}